

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_3c73d5::cmAppendPathSegmentGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmAppendPathSegmentGenerator *this,string *parent)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  if (this->NeedReset == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    this->NeedReset = true;
    local_38.View_._M_str = (parent->_M_dataplus)._M_p;
    local_38.View_._M_len = parent->_M_string_length;
    local_68.View_._M_str = local_68.Digits_;
    local_68.View_._M_len = 1;
    local_68.Digits_[0] = '/';
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_38,&local_68,&this->DirName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->NeedReset) {
      return {};
    }
    this->NeedReset = true;
    return cmStrCat(parent, '/', this->DirName);
  }